

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getBasisTransposeSolve
          (Highs *this,double *Xrhs,double *solution_vector,HighsInt *solution_num_nz,
          HighsInt *solution_indices)

{
  uint uVar1;
  HighsStatus HVar2;
  ulong uVar3;
  char *format;
  ulong uVar4;
  vector<double,_std::allocator<double>_> rhs;
  value_type_conflict1 local_58;
  string local_50;
  
  if (Xrhs == (double *)0x0) {
    format = "getBasisTransposeSolve: Xrhs is NULL\n";
  }
  else {
    if (solution_vector != (double *)0x0) {
      if ((this->ekk_instance_).status_.has_invert != false) {
        uVar1 = (this->model_).lp_.num_row_;
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_58 = 0.0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  (&rhs,(long)(int)uVar1,&local_58);
        uVar3 = 0;
        uVar4 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar4 = uVar3;
        }
        for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar3] = Xrhs[uVar3];
        }
        basisSolveInterface(this,&rhs,solution_vector,solution_num_nz,solution_indices,true);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&rhs.super__Vector_base<double,_std::allocator<double>_>);
        return kOk;
      }
      std::__cxx11::string::string((string *)&local_50,"getBasisTransposeSolve",(allocator *)&rhs);
      HVar2 = invertRequirementError(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      return HVar2;
    }
    format = "getBasisTransposeSolve: solution_vector is NULL\n";
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format);
  return kError;
}

Assistant:

HighsStatus Highs::getBasisTransposeSolve(const double* Xrhs,
                                          double* solution_vector,
                                          HighsInt* solution_num_nz,
                                          HighsInt* solution_indices) {
  if (Xrhs == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisTransposeSolve: Xrhs is NULL\n");
    return HighsStatus::kError;
  }
  if (solution_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisTransposeSolve: solution_vector is NULL\n");
    return HighsStatus::kError;
  }
  // solution_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisTransposeSolve");
  HighsInt num_row = model_.lp_.num_row_;
  vector<double> rhs;
  rhs.assign(num_row, 0);
  for (HighsInt row = 0; row < num_row; row++) rhs[row] = Xrhs[row];
  basisSolveInterface(rhs, solution_vector, solution_num_nz, solution_indices,
                      true);
  return HighsStatus::kOk;
}